

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

bool chaiscript::dispatch::detail::
     compare_types_cast<void,henson::NameMap*,std::__cxx11::string,double,0ul,1ul,2ul>
               (undefined8 param_1,long *param_2,Type_Conversions_State *param_3,
               Type_Conversions_State *param_4)

{
  Result_Type local_30;
  
  boxed_cast<henson::NameMap*>((Boxed_Value *)*param_2,param_3);
  boxed_cast<std::__cxx11::string>
            (&local_30,(chaiscript *)(*param_2 + 0x10),(Boxed_Value *)param_3,param_4);
  boxed_cast<double>((Boxed_Value *)(*param_2 + 0x20),param_3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool compare_types_cast(Indexes<I...>, Ret (*)(Params...),
             const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          try {
            (void)params; (void)t_conversions;
            (void)std::initializer_list<int>{(boxed_cast<Params>(params[I], &t_conversions), 0)...};
            return true;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }

        }